

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_ptr_field.h
# Opt level: O1

void __thiscall
google::protobuf::RepeatedPtrField<google::protobuf::compiler::CodeGeneratorResponse_File>::
InternalSwap(RepeatedPtrField<google::protobuf::compiler::CodeGeneratorResponse_File> *this,
            RepeatedPtrField<google::protobuf::compiler::CodeGeneratorResponse_File> *other)

{
  Rep *pRVar1;
  Rep *pRVar2;
  Arena *pAVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  LogMessage *other_00;
  LogFinisher local_51;
  LogMessage local_50;
  
  if (this == other) {
    internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/repeated_ptr_field.h"
               ,0x6f7);
    other_00 = internal::LogMessage::operator<<(&local_50,"CHECK failed: this != rhs: ");
    internal::LogFinisher::operator=(&local_51,other_00);
    internal::LogMessage::~LogMessage(&local_50);
  }
  pRVar1 = (other->super_RepeatedPtrFieldBase).rep_;
  pAVar3 = (other->super_RepeatedPtrFieldBase).arena_;
  iVar6 = (other->super_RepeatedPtrFieldBase).current_size_;
  iVar7 = (other->super_RepeatedPtrFieldBase).total_size_;
  pRVar2 = (this->super_RepeatedPtrFieldBase).rep_;
  iVar4 = (this->super_RepeatedPtrFieldBase).current_size_;
  iVar5 = (this->super_RepeatedPtrFieldBase).total_size_;
  (other->super_RepeatedPtrFieldBase).arena_ = (this->super_RepeatedPtrFieldBase).arena_;
  (other->super_RepeatedPtrFieldBase).current_size_ = iVar4;
  (other->super_RepeatedPtrFieldBase).total_size_ = iVar5;
  (other->super_RepeatedPtrFieldBase).rep_ = pRVar2;
  (this->super_RepeatedPtrFieldBase).arena_ = pAVar3;
  (this->super_RepeatedPtrFieldBase).current_size_ = iVar6;
  (this->super_RepeatedPtrFieldBase).total_size_ = iVar7;
  (this->super_RepeatedPtrFieldBase).rep_ = pRVar1;
  return;
}

Assistant:

void InternalSwap(RepeatedPtrField* other) {
    internal::RepeatedPtrFieldBase::InternalSwap(other);
  }